

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O0

void highbd_8_obmc_variance
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
               int *sum)

{
  int in_R8D;
  undefined4 *in_stack_00000008;
  uint64_t sse64;
  int64_t sum64;
  int64_t *in_stack_00000060;
  uint64_t *in_stack_00000068;
  int32_t *in_stack_00000070;
  int32_t *in_stack_00000078;
  int in_stack_00000084;
  uint8_t *in_stack_00000088;
  int64_t *in_stack_000000e0;
  uint64_t *in_stack_000000e8;
  int32_t *in_stack_000000f0;
  int32_t *in_stack_000000f8;
  int in_stack_00000104;
  uint8_t *in_stack_00000108;
  int in_stack_00000170;
  int in_stack_00000280;
  int in_stack_00000288;
  
  if (in_R8D == 4) {
    hbd_obmc_variance_w4
              (in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000070,
               in_stack_00000068,in_stack_00000060,in_stack_00000170);
  }
  else {
    hbd_obmc_variance_w8n
              (in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f0,
               in_stack_000000e8,in_stack_000000e0,in_stack_00000280,in_stack_00000288);
  }
  *(undefined4 *)sse64 = 0;
  *in_stack_00000008 = 0;
  return;
}

Assistant:

static inline void highbd_8_obmc_variance(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  }
  *sum = (int)sum64;
  *sse = (unsigned int)sse64;
}